

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall leveldb::VersionSet::LogAndApply(VersionSet *this,VersionEdit *edit,Mutex *mu)

{
  Logger *info_log;
  bool bVar1;
  Version *this_00;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  ulong uVar4;
  Mutex *in_RCX;
  Status local_2a0;
  Status local_298;
  Status local_290 [4];
  Status local_270;
  Slice local_268;
  undefined1 local_258 [16];
  string record;
  undefined1 local_230 [16];
  leveldb local_220 [39];
  undefined1 local_1f9;
  string local_1f8 [8];
  string new_manifest_file;
  undefined1 local_1d8 [8];
  Builder builder;
  Version *v;
  Mutex *mu_local;
  VersionEdit *edit_local;
  VersionSet *this_local;
  Status *s;
  
  if ((mu[1].mu_.super___mutex_base._M_mutex.__size[0x19] & 1U) == 0) {
    VersionEdit::SetLogNumber((VersionEdit *)mu,*(uint64_t *)&(edit->deleted_files_)._M_t._M_impl);
  }
  else {
    if ((mu->mu_).super___mutex_base._M_mutex.__data.__list.__next <
        *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl) {
      __assert_fail("edit->log_number_ >= log_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                    ,800,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    if ((edit->compact_pointers_).
        super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
        ._M_impl.super__Vector_impl_data._M_start <=
        (pointer)(mu->mu_).super___mutex_base._M_mutex.__data.__list.__next) {
      __assert_fail("edit->log_number_ < next_file_number_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                    ,0x321,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
  }
  if ((mu[1].mu_.super___mutex_base._M_mutex.__size[0x1a] & 1U) == 0) {
    VersionEdit::SetPrevLogNumber
              ((VersionEdit *)mu,
               *(uint64_t *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header);
  }
  VersionEdit::SetNextFile
            ((VersionEdit *)mu,
             (uint64_t)
             (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  VersionEdit::SetLastSequence
            ((VersionEdit *)mu,
             (SequenceNumber)
             (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (Version *)operator_new(0xe8);
  Version::Version(this_00,(VersionSet *)edit);
  Builder::Builder((Builder *)local_1d8,(VersionSet *)edit,*(Version **)&edit[2].field_0x18);
  Builder::Apply((Builder *)local_1d8,(VersionEdit *)mu);
  Builder::SaveTo((Builder *)local_1d8,this_00);
  Builder::~Builder((Builder *)local_1d8);
  Finalize((VersionSet *)edit,this_00);
  std::__cxx11::string::string(local_1f8);
  local_1f9 = 0;
  Status::Status((Status *)this);
  if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0)
  {
    if ((edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) {
      __assert_fail("descriptor_file_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                    ,0x33c,"Status leveldb::VersionSet::LogAndApply(VersionEdit *, port::Mutex *)");
    }
    DescriptorFileName(local_220,(string *)&edit->field_0x8,
                       (uint64_t)
                       (edit->compact_pointers_).
                       super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::operator=(local_1f8,(string *)local_220);
    std::__cxx11::string::~string((string *)local_220);
    VersionEdit::SetNextFile
              ((VersionEdit *)mu,
               (uint64_t)
               (edit->compact_pointers_).
               super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    (**(code **)(**(long **)edit + 0x20))
              (local_230 + 8,*(long **)edit,local_1f8,
               &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    Status::operator=((Status *)this,(Status *)(local_230 + 8));
    Status::~Status((Status *)(local_230 + 8));
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      p_Var2 = (_Base_ptr)operator_new(0x20);
      log::Writer::Writer((Writer *)p_Var2,
                          (WritableFile *)
                          (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent);
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
      WriteSnapshot((VersionSet *)local_230,(Writer *)edit);
      Status::operator=((Status *)this,(Status *)local_230);
      Status::~Status((Status *)local_230);
    }
  }
  port::Mutex::Unlock(in_RCX);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)(local_258 + 8));
    VersionEdit::EncodeTo((VersionEdit *)mu,(string *)(local_258 + 8));
    p_Var2 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Slice::Slice(&local_268,(string *)(local_258 + 8));
    log::Writer::AddRecord((Writer *)local_258,(Slice *)p_Var2);
    Status::operator=((Status *)this,(Status *)local_258);
    Status::~Status((Status *)local_258);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (**(code **)(*(long *)(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent + 0x28))(&local_270);
      Status::operator=((Status *)this,&local_270);
      Status::~Status(&local_270);
    }
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) {
      info_log = *(Logger **)(edit->prev_log_number_ + 0x18);
      Status::ToString_abi_cxx11_(local_290);
      uVar3 = std::__cxx11::string::c_str();
      Log(info_log,"MANIFEST write: %s\n",uVar3);
      std::__cxx11::string::~string((string *)local_290);
    }
    std::__cxx11::string::~string((string *)(local_258 + 8));
  }
  bVar1 = Status::ok((Status *)this);
  if ((bVar1) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    SetCurrentFile((leveldb *)&local_298,*(Env **)edit,(string *)&edit->field_0x8,
                   (uint64_t)
                   (edit->compact_pointers_).
                   super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    Status::operator=((Status *)this,&local_298);
    Status::~Status(&local_298);
  }
  port::Mutex::Lock(in_RCX);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    AppendVersion((VersionSet *)edit,this_00);
    *(__pthread_internal_list **)&(edit->deleted_files_)._M_t._M_impl =
         (mu->mu_).super___mutex_base._M_mutex.__data.__list.__next;
    *(long *)&(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header =
         mu[1].mu_.super___mutex_base._M_mutex.__align;
  }
  else {
    if (this_00 != (Version *)0x0) {
      Version::~Version(this_00);
      operator_delete(this_00);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      p_Var2 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var2 != (_Base_ptr)0x0) {
        log::Writer::~Writer((Writer *)p_Var2);
        operator_delete(p_Var2);
      }
      p_Var2 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var2 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var2 + 8))();
      }
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (**(code **)(**(long **)edit + 0x40))(&local_2a0,*(long **)edit,local_1f8);
      Status::~Status(&local_2a0);
    }
  }
  local_1f9 = 1;
  std::__cxx11::string::~string(local_1f8);
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::LogAndApply(VersionEdit* edit, port::Mutex* mu) {
  if (edit->has_log_number_) {
    assert(edit->log_number_ >= log_number_);
    assert(edit->log_number_ < next_file_number_);
  } else {
    edit->SetLogNumber(log_number_);
  }

  if (!edit->has_prev_log_number_) {
    edit->SetPrevLogNumber(prev_log_number_);
  }

  edit->SetNextFile(next_file_number_);
  edit->SetLastSequence(last_sequence_);

  Version* v = new Version(this);
  {
    Builder builder(this, current_);
    builder.Apply(edit);
    builder.SaveTo(v);
  }
  Finalize(v);

  // Initialize new descriptor log file if necessary by creating
  // a temporary file that contains a snapshot of the current version.
  std::string new_manifest_file;
  Status s;
  if (descriptor_log_ == nullptr) {
    // No reason to unlock *mu here since we only hit this path in the
    // first call to LogAndApply (when opening the database).
    assert(descriptor_file_ == nullptr);
    new_manifest_file = DescriptorFileName(dbname_, manifest_file_number_);
    edit->SetNextFile(next_file_number_);
    s = env_->NewWritableFile(new_manifest_file, &descriptor_file_);
    if (s.ok()) {
      descriptor_log_ = new log::Writer(descriptor_file_);
      s = WriteSnapshot(descriptor_log_);
    }
  }

  // Unlock during expensive MANIFEST log write
  {
    mu->Unlock();

    // Write new record to MANIFEST log
    if (s.ok()) {
      std::string record;
      edit->EncodeTo(&record);
      s = descriptor_log_->AddRecord(record);
      if (s.ok()) {
        s = descriptor_file_->Sync();
      }
      if (!s.ok()) {
        Log(options_->info_log, "MANIFEST write: %s\n", s.ToString().c_str());
      }
    }

    // If we just created a new descriptor file, install it by writing a
    // new CURRENT file that points to it.
    if (s.ok() && !new_manifest_file.empty()) {
      s = SetCurrentFile(env_, dbname_, manifest_file_number_);
    }

    mu->Lock();
  }

  // Install the new version
  if (s.ok()) {
    AppendVersion(v);
    log_number_ = edit->log_number_;
    prev_log_number_ = edit->prev_log_number_;
  } else {
    delete v;
    if (!new_manifest_file.empty()) {
      delete descriptor_log_;
      delete descriptor_file_;
      descriptor_log_ = nullptr;
      descriptor_file_ = nullptr;
      env_->DeleteFile(new_manifest_file);
    }
  }

  return s;
}